

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O2

void __thiscall
AnonADIOSFile::AnonADIOSFile
          (AnonADIOSFile *this,string *FileName,RemoteFileMode mode,bool RowMajorArrays)

{
  IO *pIVar1;
  Engine *pEVar2;
  string local_70 [32];
  string local_50 [32];
  
  this->m_io = (IO *)0x0;
  this->m_engine = (Engine *)0x0;
  this->currentStep = -1;
  (this->m_IOname)._M_dataplus._M_p = (pointer)&(this->m_IOname).field_2;
  (this->m_IOname)._M_string_length = 0;
  (this->m_IOname).field_2._M_local_buf[0] = '\0';
  (this->m_FileName)._M_dataplus._M_p = (pointer)&(this->m_FileName).field_2;
  (this->m_FileName)._M_string_length = 0;
  (this->m_FileName).field_2._M_local_buf[0] = '\0';
  this->m_BytesSent = 0;
  this->m_OperationCount = 0;
  this->m_mode = RemoteOpen;
  std::__cxx11::string::_M_assign((string *)&this->m_FileName);
  lf_random_string_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->m_IOname,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string(local_70,(string *)&this->m_IOname);
  pIVar1 = (IO *)adios2::core::ADIOS::DeclareIO(adios,local_70,!RowMajorArrays);
  this->m_io = pIVar1;
  std::__cxx11::string::~string(local_70);
  this->m_mode = mode;
  pEVar2 = (Engine *)adios2::core::IO::Open((string *)this->m_io,(Mode)FileName);
  this->m_engine = pEVar2;
  this->m_ID = *(int64_t *)(this->m_IOname)._M_dataplus._M_p;
  return;
}

Assistant:

AnonADIOSFile(std::string FileName, EVPathRemoteCommon::RemoteFileMode mode,
                  bool RowMajorArrays)
    {
        Mode adios_read_mode = adios2::Mode::Read;
        m_FileName = FileName;
        m_IOname = lf_random_string();
        ArrayOrdering ArrayOrder =
            RowMajorArrays ? ArrayOrdering::RowMajor : ArrayOrdering::ColumnMajor;
        m_io = &adios.DeclareIO(m_IOname, ArrayOrder);
        m_mode = mode;
        if (m_mode == RemoteOpenRandomAccess)
            adios_read_mode = adios2::Mode::ReadRandomAccess;
        m_engine = &m_io->Open(FileName, adios_read_mode);
        memcpy(&m_ID, m_IOname.c_str(), sizeof(m_ID));
    }